

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

int Rtm_ObjCheckRetimeBwd(Rtm_Obj_t *pObj)

{
  long lVar1;
  
  if (0 < (long)pObj->nFanouts) {
    lVar1 = 0;
    do {
      if ((**(ushort **)
             (&pObj[1].field_0x8 + lVar1 + (ulong)(*(uint *)&pObj->field_0x8 >> 3 & 0xff0)) & 0xfff)
          == 0) {
        return 0;
      }
      lVar1 = lVar1 + 0x10;
    } while ((long)pObj->nFanouts * 0x10 != lVar1);
  }
  return 1;
}

Assistant:

int Rtm_ObjCheckRetimeBwd( Rtm_Obj_t * pObj )
{
    Rtm_Edg_t * pEdge;
    int i;
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        if ( pEdge->nLats == 0 )
            return 0;
    return 1;
}